

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> * __thiscall
tcb::unicode::detail::unicode_view::operator_cast_to_u32string
          (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
           *__return_storage_ptr__,unicode_view *this)

{
  iterator __beg;
  iterator __end;
  allocator<char32_t> local_59;
  iterator local_58;
  iterator local_38;
  unicode_view *local_18;
  unicode_view<__gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_char16_t,_char32_t>
  *this_local;
  
  local_18 = this;
  this_local = (unicode_view<__gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_char16_t,_char32_t>
                *)__return_storage_ptr__;
  unicode_view<__gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_char16_t,_char32_t>
  ::begin(&local_38,
          (unicode_view<__gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_char16_t,_char32_t>
           *)this);
  unicode_view<__gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_char16_t,_char32_t>
  ::end(&local_58,
        (unicode_view<__gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,___gnu_cxx::__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_char16_t,_char32_t>
         *)this);
  std::allocator<char32_t>::allocator(&local_59);
  __beg.first_._M_current = local_38.first_._M_current;
  __beg.next_chars_ = local_38.next_chars_;
  __beg.last_._M_current = local_38.last_._M_current;
  __beg.idx_ = local_38.idx_;
  __beg._25_7_ = local_38._25_7_;
  __end.first_._M_current = local_58.first_._M_current;
  __end.next_chars_ = local_58.next_chars_;
  __end.last_._M_current = local_58.last_._M_current;
  __end.idx_ = local_58.idx_;
  __end._25_7_ = local_58._25_7_;
  std::__cxx11::u32string::
  u32string<tcb::unicode::detail::unicode_view<__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,char16_t,char32_t>::iterator,void>
            ((u32string *)__return_storage_ptr__,__beg,__end,&local_59);
  std::allocator<char32_t>::~allocator(&local_59);
  return __return_storage_ptr__;
}

Assistant:

constexpr operator Container() const
    {
        return Container(begin(), end());
    }